

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [24];
  undefined1 auVar17 [24];
  __m256i alVar18;
  __m256i *palVar19;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  __m256i vH_1;
  __m256i vFt;
  __m256i vW;
  __m256i *pvW;
  __m256i vHp;
  __m256i vH;
  __m256i vF;
  __m256i vHt;
  __m256i vE;
  __m256i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_32_t e;
  __m256i_32_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int32_t score;
  __m256i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapper;
  __m256i *pvH;
  __m256i *pvHt;
  int32_t *boundary;
  __m256i *pvE;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int local_e98;
  long local_e90;
  int local_e88;
  int local_e6c;
  undefined1 local_e60 [32];
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  __m256i local_de0;
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  undefined1 local_d80 [32];
  longlong local_d60;
  longlong lStack_d58;
  longlong lStack_d50;
  longlong lStack_d48;
  undefined1 local_d40 [32];
  longlong local_d00;
  longlong lStack_cf8;
  longlong lStack_cf0;
  longlong lStack_ce8;
  longlong local_ce0;
  longlong lStack_cd8;
  longlong lStack_cd0;
  longlong lStack_cc8;
  int local_cb0;
  int local_cac;
  parasail_result_t *local_ca8;
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  uint local_bc4;
  undefined8 local_bc0;
  ulong uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  uint local_b88;
  uint local_b84;
  undefined1 local_b80 [16];
  undefined1 auStack_b70 [16];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  __m256i *local_b28;
  __m256i *local_b20;
  __m256i *local_b18;
  int32_t *local_b10;
  __m256i *local_b08;
  long local_b00;
  int local_af8;
  int local_af4;
  int local_af0;
  int local_aec;
  long local_ae8;
  int local_adc;
  int local_ad8;
  int local_ad4;
  int local_ad0;
  int local_acc;
  int local_ac8;
  uint local_ac4;
  uint local_ac0;
  int local_abc;
  long local_ab8;
  parasail_result_t *local_aa8;
  uint local_a9c;
  uint local_a98;
  uint local_a94;
  uint local_a90;
  uint local_a8c;
  undefined1 local_a80 [32];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  longlong local_9e0;
  longlong lStack_9d8;
  longlong lStack_9d0;
  longlong lStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  longlong local_9a0;
  longlong lStack_998;
  longlong lStack_990;
  longlong lStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  longlong local_940;
  longlong lStack_938;
  longlong lStack_930;
  longlong lStack_928;
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  longlong local_8e0;
  longlong lStack_8d8;
  longlong lStack_8d0;
  longlong lStack_8c8;
  __m256i *local_8a8;
  longlong local_8a0;
  longlong lStack_898;
  longlong lStack_890;
  longlong lStack_888;
  __m256i *local_868;
  longlong local_860;
  longlong lStack_858;
  longlong lStack_850;
  longlong lStack_848;
  __m256i *local_828;
  longlong local_820;
  longlong lStack_818;
  longlong lStack_810;
  longlong lStack_808;
  __m256i *local_7e8;
  __m256i *local_7a8;
  __m256i *local_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [16];
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  longlong lStack_6a8;
  undefined1 local_6a0 [16];
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  longlong lStack_668;
  longlong local_660;
  longlong lStack_658;
  longlong lStack_650;
  longlong lStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined8 uStack_610;
  undefined8 uStack_608;
  longlong local_600;
  longlong lStack_5f8;
  longlong lStack_5f0;
  longlong lStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  ulong uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  __m256i *local_590;
  __m256i *local_588;
  undefined1 (*local_580) [32];
  __m256i *local_578;
  __m256i *local_570;
  __m256i *local_568;
  longlong local_560;
  longlong lStack_558;
  longlong lStack_550;
  longlong lStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  longlong lStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  longlong local_3e0;
  longlong lStack_3d8;
  longlong lStack_3d0;
  longlong lStack_3c8;
  longlong local_3c0;
  longlong lStack_3b8;
  longlong lStack_3b0;
  longlong lStack_3a8;
  undefined1 local_3a0 [32];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  longlong local_320;
  longlong lStack_318;
  longlong lStack_310;
  longlong lStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined1 local_1c0 [32];
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_ac8 = 0;
  local_acc = 0;
  local_ad0 = 0;
  local_ad4 = 0;
  local_ad8 = 0;
  local_adc = 0;
  local_ae8 = 0;
  local_aec = 0;
  local_af0 = 0;
  local_af4 = 0;
  local_af8 = 0;
  local_b00 = 0;
  local_b08 = (__m256i *)0x0;
  local_b10 = (int32_t *)0x0;
  local_b18 = (__m256i *)0x0;
  local_b20 = (__m256i *)0x0;
  local_b28 = (__m256i *)0x0;
  local_b84 = 0;
  local_b88 = 0;
  local_bc4 = 0;
  local_ca8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_scan_profile_avx2_256_32","profile");
    local_aa8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x48) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_scan_profile_avx2_256_32",
            "profile->profile32.score");
    local_aa8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_scan_profile_avx2_256_32","profile->matrix");
    local_aa8 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_scan_profile_avx2_256_32","profile->s1Len");
    local_aa8 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_scan_profile_avx2_256_32","s2");
    local_aa8 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_scan_profile_avx2_256_32","s2Len");
    local_aa8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_scan_profile_avx2_256_32","open");
    local_aa8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_scan_profile_avx2_256_32","gap");
    local_aa8 = (parasail_result_t *)0x0;
  }
  else {
    local_ac8 = 0;
    local_acc = 0;
    local_ad0 = 0;
    local_ad4 = *(int *)(in_RDI + 8);
    local_ad8 = local_ad4 + -1;
    local_adc = in_EDX + -1;
    local_ae8 = *(long *)(in_RDI + 0x10);
    local_aec = 8;
    local_af0 = (local_ad4 + 7) / 8;
    local_af4 = (local_ad4 + -1) % local_af0;
    local_af8 = ~((local_ad4 + -1) / local_af0) + 8;
    local_b00 = *(long *)(in_RDI + 0x48);
    auVar2 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar2 = vpinsrd_avx(auVar2,in_ECX,2);
    local_200 = vpinsrd_avx(auVar2,in_ECX,3);
    auVar2 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar2 = vpinsrd_avx(auVar2,in_ECX,2);
    auStack_1f0 = vpinsrd_avx(auVar2,in_ECX,3);
    local_b60 = local_200._0_8_;
    uStack_b58 = local_200._8_8_;
    uStack_b50 = auStack_1f0._0_8_;
    uStack_b48 = auStack_1f0._8_8_;
    auVar2 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar2 = vpinsrd_avx(auVar2,in_R8D,2);
    auVar2 = vpinsrd_avx(auVar2,in_R8D,3);
    auVar3 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar3 = vpinsrd_avx(auVar3,in_R8D,2);
    auVar3 = vpinsrd_avx(auVar3,in_R8D,3);
    local_1c0._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    local_1c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    if ((int)-in_ECX < *(int *)(local_ae8 + 0x20)) {
      local_e6c = in_ECX + 0x80000000;
    }
    else {
      local_e6c = -0x80000000 - *(int *)(local_ae8 + 0x20);
    }
    local_bc4 = local_e6c + 1;
    local_b88 = 0x7ffffffe - *(int *)(local_ae8 + 0x1c);
    local_a80._8_8_ = SUB328(ZEXT832(0),4);
    local_bc0 = 0;
    uStack_bb8 = local_a80._8_8_;
    uStack_bb0 = 0;
    uStack_ba8 = 0;
    auVar2 = vpinsrd_avx(ZEXT416(local_bc4),local_bc4,1);
    auVar2 = vpinsrd_avx(auVar2,local_bc4,2);
    local_180 = vpinsrd_avx(auVar2,local_bc4,3);
    auVar2 = vpinsrd_avx(ZEXT416(local_bc4),local_bc4,1);
    auVar2 = vpinsrd_avx(auVar2,local_bc4,2);
    auStack_170 = vpinsrd_avx(auVar2,local_bc4,3);
    local_c00 = local_180._0_8_;
    uStack_bf8 = local_180._8_8_;
    uStack_bf0 = auStack_170._0_8_;
    uStack_be8 = auStack_170._8_8_;
    auVar2 = vpinsrd_avx(ZEXT416(local_b88),local_b88,1);
    auVar2 = vpinsrd_avx(auVar2,local_b88,2);
    local_140 = vpinsrd_avx(auVar2,local_b88,3);
    auVar2 = vpinsrd_avx(ZEXT416(local_b88),local_b88,1);
    auVar2 = vpinsrd_avx(auVar2,local_b88,2);
    auStack_130 = vpinsrd_avx(auVar2,local_b88,3);
    local_c20 = local_140._0_8_;
    uStack_c18 = local_140._8_8_;
    uStack_c10 = auStack_130._0_8_;
    uStack_c08 = auStack_130._8_8_;
    local_c40._16_8_ = auStack_130._0_8_;
    local_c40._0_16_ = local_140;
    local_c40._24_8_ = auStack_130._8_8_;
    local_c60._16_8_ = auStack_170._0_8_;
    local_c60._0_16_ = local_180;
    local_c60._24_8_ = auStack_170._8_8_;
    local_c80 = ZEXT832((ulong)local_a80._8_8_) << 0x40;
    local_c80 = vpblendd_avx2(local_c80,ZEXT432(local_bc4),1);
    local_a94 = -local_af0 * in_R8D;
    auVar2 = vpinsrd_avx(ZEXT416(local_a94),local_a94,1);
    auVar2 = vpinsrd_avx(auVar2,local_a94,2);
    local_100 = vpinsrd_avx(auVar2,local_a94,3);
    auVar2 = vpinsrd_avx(ZEXT416(local_a94),local_a94,1);
    auVar2 = vpinsrd_avx(auVar2,local_a94,2);
    auStack_f0 = vpinsrd_avx(auVar2,local_a94,3);
    auVar6._16_16_ = auStack_f0;
    auVar6._0_16_ = local_100;
    local_a98 = -local_af0 * in_R8D;
    auVar2 = vpinsrd_avx(ZEXT416(local_a98),local_a98,1);
    auVar2 = vpinsrd_avx(auVar2,local_a98,2);
    local_c0 = vpinsrd_avx(auVar2,local_a98,3);
    auVar2 = vpinsrd_avx(ZEXT416(local_a98),local_a98,1);
    auVar2 = vpinsrd_avx(auVar2,local_a98,2);
    auStack_b0 = vpinsrd_avx(auVar2,local_a98,3);
    auVar7._16_16_ = auStack_b0;
    auVar7._0_16_ = local_c0;
    local_a9c = -local_af0 * in_R8D;
    auVar2 = vpinsrd_avx(ZEXT416(local_a9c),local_a9c,1);
    auVar2 = vpinsrd_avx(auVar2,local_a9c,2);
    local_80 = vpinsrd_avx(auVar2,local_a9c,3);
    auVar2 = vpinsrd_avx(ZEXT416(local_a9c),local_a9c,1);
    auVar2 = vpinsrd_avx(auVar2,local_a9c,2);
    local_70 = vpinsrd_avx(auVar2,local_a9c,3);
    auVar7 = vperm2i128_avx2(ZEXT1632(local_80),auVar7,0x28);
    local_920 = vpalignr_avx2(auVar6,auVar7,0xc);
    local_900 = local_c80._0_8_;
    uStack_8f8 = local_c80._8_8_;
    uStack_8f0 = local_c80._16_8_;
    uStack_8e8 = local_c80._24_8_;
    local_ca0 = vpaddd_avx2(local_c80,local_920);
    local_b84 = local_bc4;
    local_ac4 = in_R8D;
    local_ac0 = in_ECX;
    local_abc = in_EDX;
    local_ab8 = in_RSI;
    local_a90 = local_b88;
    local_a8c = local_bc4;
    local_a80 = ZEXT832(0) << 0x20;
    local_160 = local_bc4;
    local_15c = local_bc4;
    local_158 = local_bc4;
    local_154 = local_bc4;
    local_150 = local_bc4;
    local_14c = local_bc4;
    local_148 = local_bc4;
    local_144 = local_bc4;
    local_120 = local_b88;
    local_11c = local_b88;
    local_118 = local_b88;
    local_114 = local_b88;
    local_110 = local_b88;
    local_10c = local_b88;
    local_108 = local_b88;
    local_104 = local_b88;
    local_e0 = local_a94;
    local_dc = local_a94;
    local_d8 = local_a94;
    local_d4 = local_a94;
    local_d0 = local_a94;
    local_cc = local_a94;
    local_c8 = local_a94;
    local_c4 = local_a94;
    local_a0 = local_a98;
    local_9c = local_a98;
    local_98 = local_a98;
    local_94 = local_a98;
    local_90 = local_a98;
    local_8c = local_a98;
    local_88 = local_a98;
    local_84 = local_a98;
    local_50 = local_a9c;
    local_4c = local_a9c;
    local_48 = local_a9c;
    local_44 = local_a9c;
    local_40 = local_a9c;
    local_3c = local_a9c;
    local_38 = local_a9c;
    local_34 = local_a9c;
    local_b80 = local_1c0._0_16_;
    auStack_b70 = local_1c0._16_16_;
    local_ca8 = parasail_result_new();
    if (local_ca8 == (parasail_result_t *)0x0) {
      local_aa8 = (parasail_result_t *)0x0;
    }
    else {
      local_ca8->flag = local_ca8->flag | 0x8400401;
      local_b08 = parasail_memalign___m256i(0x20,(long)local_af0);
      local_b10 = parasail_memalign_int32_t(0x20,(long)(local_abc + 1));
      local_b18 = parasail_memalign___m256i(0x20,(long)local_af0);
      local_b20 = parasail_memalign___m256i(0x20,(long)local_af0);
      local_b28 = parasail_memalign___m256i(0x20,(long)local_af0);
      if (local_b08 == (__m256i *)0x0) {
        local_aa8 = (parasail_result_t *)0x0;
      }
      else if (local_b10 == (int32_t *)0x0) {
        local_aa8 = (parasail_result_t *)0x0;
      }
      else if (local_b18 == (__m256i *)0x0) {
        local_aa8 = (parasail_result_t *)0x0;
      }
      else if (local_b20 == (__m256i *)0x0) {
        local_aa8 = (parasail_result_t *)0x0;
      }
      else if (local_b28 == (__m256i *)0x0) {
        local_aa8 = (parasail_result_t *)0x0;
      }
      else {
        local_cac = 0;
        local_ac8 = 0;
        while( true ) {
          if (local_af0 <= local_ac8) break;
          for (local_cb0 = 0; local_cb0 < local_aec; local_cb0 = local_cb0 + 1) {
            local_e88 = -(local_ac4 * (local_cb0 * local_af0 + local_ac8)) - local_ac0;
            local_e90 = (long)local_e88;
            if (local_e90 < -0x80000000) {
              local_e88 = -0x80000000;
            }
            *(int *)((long)&local_ce0 + (long)local_cb0 * 4) = local_e88;
            local_e90 = local_e90 - (int)local_ac0;
            if (local_e90 < -0x80000000) {
              local_e90 = -0x80000000;
            }
            *(int *)((long)&local_d00 + (long)local_cb0 * 4) = (int)local_e90;
          }
          local_768 = local_b20 + local_cac;
          (*local_768)[0] = local_ce0;
          (*local_768)[1] = lStack_cd8;
          (*local_768)[2] = lStack_cd0;
          (*local_768)[3] = lStack_cc8;
          local_7a8 = local_b08 + local_cac;
          (*local_7a8)[0] = local_d00;
          (*local_7a8)[1] = lStack_cf8;
          (*local_7a8)[2] = lStack_cf0;
          (*local_7a8)[3] = lStack_ce8;
          local_cac = local_cac + 1;
          local_ac8 = local_ac8 + 1;
        }
        *local_b10 = 0;
        for (local_ac8 = 1; local_ac8 <= local_abc; local_ac8 = local_ac8 + 1) {
          local_e98 = -(local_ac4 * (local_ac8 + -1)) - local_ac0;
          if (local_e98 < -0x80000000) {
            local_e98 = -0x80000000;
          }
          local_b10[local_ac8] = local_e98;
        }
        local_5c0 = local_bc0;
        uStack_5b8 = uStack_bb8;
        uStack_5b0 = uStack_bb0;
        uStack_5a8 = uStack_ba8;
        local_5e0 = local_b60;
        uStack_5d8 = uStack_b58;
        uStack_5d0 = uStack_b50;
        uStack_5c8 = uStack_b48;
        auVar13._8_8_ = uStack_bb8;
        auVar13._0_8_ = local_bc0;
        auVar13._16_8_ = uStack_bb0;
        auVar13._24_8_ = uStack_ba8;
        auVar5._8_8_ = uStack_b58;
        auVar5._0_8_ = local_b60;
        auVar5._16_8_ = uStack_b50;
        auVar5._24_8_ = uStack_b48;
        local_d40 = vpsubd_avx2(auVar13,auVar5);
        local_ac8 = local_af0;
        while (local_ac8 = local_ac8 + -1, -1 < local_ac8) {
          local_7e8 = local_b28 + local_ac8;
          local_820 = local_d40._0_8_;
          lStack_818 = local_d40._8_8_;
          lStack_810 = local_d40._16_8_;
          lStack_808 = local_d40._24_8_;
          (*local_7e8)[0] = local_d40._0_8_;
          (*local_7e8)[1] = local_d40._8_8_;
          (*local_7e8)[2] = local_d40._16_8_;
          (*local_7e8)[3] = local_d40._24_8_;
          local_600 = local_d40._0_8_;
          lStack_5f8 = local_d40._8_8_;
          lStack_5f0 = local_d40._16_8_;
          lStack_5e8 = local_d40._24_8_;
          uStack_610 = auStack_b70._0_8_;
          uStack_608 = auStack_b70._8_8_;
          auVar5._16_8_ = auStack_b70._0_8_;
          auVar5._0_16_ = local_b80;
          auVar5._24_8_ = auStack_b70._8_8_;
          local_d40 = vpsubd_avx2(local_d40,auVar5);
          local_620 = local_b80;
        }
        for (local_acc = 0; local_acc < local_abc; local_acc = local_acc + 1) {
          local_568 = local_b20 + (local_af0 + -1);
          auVar7 = vperm2i128_avx2(auVar5,(undefined1  [32])*local_568,0x28);
          auVar7 = vpalignr_avx2((undefined1  [32])*local_568,auVar7,0xc);
          local_de0 = (__m256i)vpblendd_avx2(auVar7,ZEXT432((uint)local_b10[local_acc]),1);
          iVar1 = *(int *)(*(long *)(local_ae8 + 0x10) + (ulong)*(byte *)(local_ab8 + local_acc) * 4
                          );
          local_640 = local_c00;
          uStack_638 = uStack_bf8;
          uStack_630 = uStack_bf0;
          uStack_628 = uStack_be8;
          local_660 = (*local_b28)[0];
          lStack_658 = (*local_b28)[1];
          lStack_650 = (*local_b28)[2];
          lStack_648 = (*local_b28)[3];
          alVar4 = *local_b28;
          auVar12._8_8_ = uStack_bf8;
          auVar12._0_8_ = local_c00;
          auVar12._16_8_ = uStack_bf0;
          auVar12._24_8_ = uStack_be8;
          local_d80 = vpsubd_avx2(auVar12,(undefined1  [32])alVar4);
          local_da0._8_8_ = uStack_bf8;
          local_da0._0_8_ = local_c00;
          local_da0._16_8_ = uStack_bf0;
          local_da0._24_8_ = uStack_be8;
          local_ac8 = 0;
          while( true ) {
            if (local_af0 <= local_ac8) break;
            local_570 = local_b20 + local_ac8;
            auVar16 = *(undefined1 (*) [24])*local_570;
            lStack_6a8 = (*local_570)[3];
            alVar18 = *local_570;
            local_578 = local_b08 + local_ac8;
            auVar17 = *(undefined1 (*) [24])*local_578;
            lStack_668 = (*local_578)[3];
            local_580 = (undefined1 (*) [32])
                        (local_b00 + (long)(iVar1 * local_af0) * 0x20 + (long)local_ac8 * 0x20);
            local_960 = *(undefined8 *)*local_580;
            uStack_958 = *(undefined8 *)(*local_580 + 8);
            uStack_950 = *(undefined8 *)(*local_580 + 0x10);
            uStack_948 = *(undefined8 *)(*local_580 + 0x18);
            local_d60 = auVar17._0_8_;
            local_680 = local_d60;
            lStack_d58 = auVar17._8_8_;
            uStack_678 = lStack_d58;
            lStack_d50 = auVar17._16_8_;
            uStack_670 = lStack_d50;
            uStack_690 = auStack_b70._0_8_;
            uStack_688 = auStack_b70._8_8_;
            auVar11._16_8_ = auStack_b70._0_8_;
            auVar11._0_16_ = local_b80;
            auVar11._24_8_ = auStack_b70._8_8_;
            local_340 = vpsubd_avx2((undefined1  [32])*local_578,auVar11);
            local_dc0._0_8_ = auVar16._0_8_;
            local_6c0 = local_dc0._0_8_;
            local_dc0._8_8_ = auVar16._8_8_;
            uStack_6b8 = local_dc0._8_8_;
            local_dc0._16_8_ = auVar16._16_8_;
            uStack_6b0 = local_dc0._16_8_;
            local_6e0 = local_b60;
            uStack_6d8 = uStack_b58;
            uStack_6d0 = uStack_b50;
            uStack_6c8 = uStack_b48;
            auVar10._8_8_ = uStack_b58;
            auVar10._0_8_ = local_b60;
            auVar10._16_8_ = uStack_b50;
            auVar10._24_8_ = uStack_b48;
            local_360 = vpsubd_avx2((undefined1  [32])*local_570,auVar10);
            auVar7 = vpmaxsd_avx2(local_340,local_360);
            local_940 = local_de0[0];
            lStack_938 = local_de0[1];
            lStack_930 = local_de0[2];
            lStack_928 = local_de0[3];
            alVar4 = (__m256i)vpaddd_avx2((undefined1  [32])local_de0,*local_580);
            local_380 = local_da0._0_8_;
            uStack_378 = local_da0._8_8_;
            uStack_370 = local_da0._16_8_;
            uStack_368 = local_da0._24_8_;
            local_980 = local_d80._0_8_;
            uStack_978 = local_d80._8_8_;
            uStack_970 = local_d80._16_8_;
            uStack_968 = local_d80._24_8_;
            palVar19 = local_b28 + local_ac8;
            local_9a0 = (*palVar19)[0];
            lStack_998 = (*palVar19)[1];
            lStack_990 = (*palVar19)[2];
            lStack_988 = (*palVar19)[3];
            local_3a0 = vpaddd_avx2(local_d80,(undefined1  [32])*palVar19);
            local_da0 = vpmaxsd_avx2(local_da0,local_3a0);
            local_d60 = auVar7._0_8_;
            local_3c0 = local_d60;
            lStack_d58 = auVar7._8_8_;
            lStack_3b8 = lStack_d58;
            lStack_d50 = auVar7._16_8_;
            lStack_3b0 = lStack_d50;
            lStack_d48 = auVar7._24_8_;
            lStack_3a8 = lStack_d48;
            local_de0[0] = alVar4[0];
            local_3e0 = local_de0[0];
            local_de0[1] = alVar4[1];
            lStack_3d8 = local_de0[1];
            local_de0[2] = alVar4[2];
            lStack_3d0 = local_de0[2];
            local_de0[3] = alVar4[3];
            lStack_3c8 = local_de0[3];
            local_d80 = vpmaxsd_avx2(auVar7,(undefined1  [32])alVar4);
            local_828 = local_b08 + local_ac8;
            local_860 = local_d60;
            lStack_858 = lStack_d58;
            lStack_850 = lStack_d50;
            lStack_848 = lStack_d48;
            (*local_828)[0] = local_d60;
            (*local_828)[1] = lStack_d58;
            (*local_828)[2] = lStack_d50;
            (*local_828)[3] = lStack_d48;
            local_868 = local_b18 + local_ac8;
            local_8a0 = local_d80._0_8_;
            lStack_898 = local_d80._8_8_;
            lStack_890 = local_d80._16_8_;
            lStack_888 = local_d80._24_8_;
            (*local_868)[0] = local_d80._0_8_;
            (*local_868)[1] = local_d80._8_8_;
            (*local_868)[2] = local_d80._16_8_;
            (*local_868)[3] = local_d80._24_8_;
            local_ac8 = local_ac8 + 1;
            local_de0 = alVar18;
            local_6a0 = local_b80;
          }
          auVar7 = vperm2i128_avx2((undefined1  [32])alVar4,local_d80,0x28);
          auVar7 = vpalignr_avx2(local_d80,auVar7,0xc);
          auVar6 = vpblendd_avx2(auVar7,ZEXT432((uint)local_b10[(long)local_acc + 1]),1);
          local_400 = local_da0._0_8_;
          uStack_3f8 = local_da0._8_8_;
          uStack_3f0 = local_da0._16_8_;
          uStack_3e8 = local_da0._24_8_;
          local_d80._0_8_ = auVar6._0_8_;
          local_9c0 = local_d80._0_8_;
          local_d80._8_8_ = auVar6._8_8_;
          uStack_9b8 = local_d80._8_8_;
          local_d80._16_8_ = auVar6._16_8_;
          uStack_9b0 = local_d80._16_8_;
          local_d80._24_8_ = auVar6._24_8_;
          uStack_9a8 = local_d80._24_8_;
          local_9e0 = (*local_b28)[0];
          lStack_9d8 = (*local_b28)[1];
          lStack_9d0 = (*local_b28)[2];
          lStack_9c8 = (*local_b28)[3];
          local_420 = vpaddd_avx2(auVar6,(undefined1  [32])*local_b28);
          local_da0 = vpmaxsd_avx2(local_da0,local_420);
          auVar7 = local_420;
          for (local_ac8 = 0; local_ac8 < local_aec + -2; local_ac8 = local_ac8 + 1) {
            auVar7 = vperm2i128_avx2(auVar7,local_da0,0x28);
            auVar7 = vpalignr_avx2(local_da0,auVar7,0xc);
            local_e40 = auVar7._0_8_;
            local_a00 = local_e40;
            uStack_e38 = auVar7._8_8_;
            uStack_9f8 = uStack_e38;
            uStack_e30 = auVar7._16_8_;
            uStack_9f0 = uStack_e30;
            uStack_e28 = auVar7._24_8_;
            uStack_9e8 = uStack_e28;
            local_a20 = local_ca0._0_8_;
            uStack_a18 = local_ca0._8_8_;
            uStack_a10 = local_ca0._16_8_;
            uStack_a08 = local_ca0._24_8_;
            auVar7 = vpaddd_avx2(auVar7,local_ca0);
            local_440 = local_da0._0_8_;
            uStack_438 = local_da0._8_8_;
            uStack_430 = local_da0._16_8_;
            uStack_428 = local_da0._24_8_;
            local_e40 = auVar7._0_8_;
            local_460 = local_e40;
            uStack_e38 = auVar7._8_8_;
            uStack_458 = uStack_e38;
            uStack_e30 = auVar7._16_8_;
            uStack_450 = uStack_e30;
            uStack_e28 = auVar7._24_8_;
            uStack_448 = uStack_e28;
            local_da0 = vpmaxsd_avx2(local_da0,auVar7);
          }
          auVar7 = vperm2i128_avx2(auVar7,local_da0,0x28);
          auVar7 = vpalignr_avx2(local_da0,auVar7,0xc);
          local_da0._0_8_ = auVar7._0_8_;
          local_a40 = local_da0._0_8_;
          local_da0._8_8_ = auVar7._8_8_;
          uStack_a38 = local_da0._8_8_;
          local_da0._16_8_ = auVar7._16_8_;
          uStack_a30 = local_da0._16_8_;
          local_da0._24_8_ = auVar7._24_8_;
          uStack_a28 = local_da0._24_8_;
          local_a60 = local_c80._0_8_;
          uStack_a58 = local_c80._8_8_;
          uStack_a50 = local_c80._16_8_;
          uStack_a48 = local_c80._24_8_;
          auVar5 = vpaddd_avx2(auVar7,local_c80);
          local_480 = local_d80._0_8_;
          uStack_478 = local_d80._8_8_;
          uStack_470 = local_d80._16_8_;
          uStack_468 = local_d80._24_8_;
          local_da0._0_8_ = auVar5._0_8_;
          local_4a0 = local_da0._0_8_;
          local_da0._8_8_ = auVar5._8_8_;
          uStack_498 = local_da0._8_8_;
          local_da0._16_8_ = auVar5._16_8_;
          uStack_490 = local_da0._16_8_;
          local_da0._24_8_ = auVar5._24_8_;
          uStack_488 = local_da0._24_8_;
          local_dc0 = vpmaxsd_avx2(auVar6,auVar5);
          local_da0 = auVar5;
          for (local_ac8 = 0; local_ac8 < local_af0; local_ac8 = local_ac8 + 1) {
            local_588 = local_b18 + local_ac8;
            auVar16 = *(undefined1 (*) [24])*local_588;
            lStack_4e8 = (*local_588)[3];
            local_700 = local_da0._0_8_;
            uStack_6f8 = local_da0._8_8_;
            uStack_6f0 = local_da0._16_8_;
            uStack_6e8 = local_da0._24_8_;
            uStack_710 = auStack_b70._0_8_;
            uStack_708 = auStack_b70._8_8_;
            auVar9._16_8_ = auStack_b70._0_8_;
            auVar9._0_16_ = local_b80;
            auVar9._24_8_ = auStack_b70._8_8_;
            local_4c0 = vpsubd_avx2(local_da0,auVar9);
            local_740 = local_dc0._0_8_;
            uStack_738 = local_dc0._8_8_;
            uStack_730 = local_dc0._16_8_;
            uStack_728 = local_dc0._24_8_;
            local_760 = local_b60;
            uStack_758 = uStack_b58;
            uStack_750 = uStack_b50;
            uStack_748 = uStack_b48;
            auVar8._8_8_ = uStack_b58;
            auVar8._0_8_ = local_b60;
            auVar8._16_8_ = uStack_b50;
            auVar8._24_8_ = uStack_b48;
            local_4e0 = vpsubd_avx2(local_dc0,auVar8);
            local_da0 = vpmaxsd_avx2(local_4c0,local_4e0);
            local_d80._0_8_ = auVar16._0_8_;
            local_500 = local_d80._0_8_;
            local_d80._8_8_ = auVar16._8_8_;
            uStack_4f8 = local_d80._8_8_;
            local_d80._16_8_ = auVar16._16_8_;
            uStack_4f0 = local_d80._16_8_;
            local_520 = local_da0._0_8_;
            uStack_518 = local_da0._8_8_;
            uStack_510 = local_da0._16_8_;
            uStack_508 = local_da0._24_8_;
            auVar5 = vpmaxsd_avx2((undefined1  [32])*local_588,local_da0);
            local_8a8 = local_b20 + local_ac8;
            local_dc0._0_8_ = auVar5._0_8_;
            local_8e0 = local_dc0._0_8_;
            local_dc0._8_8_ = auVar5._8_8_;
            lStack_8d8 = local_dc0._8_8_;
            local_dc0._16_8_ = auVar5._16_8_;
            lStack_8d0 = local_dc0._16_8_;
            local_dc0._24_8_ = auVar5._24_8_;
            lStack_8c8 = local_dc0._24_8_;
            (*local_8a8)[0] = local_dc0._0_8_;
            (*local_8a8)[1] = local_dc0._8_8_;
            (*local_8a8)[2] = local_dc0._16_8_;
            (*local_8a8)[3] = local_dc0._24_8_;
            local_300 = local_c40._0_8_;
            uStack_2f8 = local_c40._8_8_;
            uStack_2f0 = local_c40._16_8_;
            uStack_2e8 = local_c40._24_8_;
            local_320 = local_dc0._0_8_;
            lStack_318 = local_dc0._8_8_;
            lStack_310 = local_dc0._16_8_;
            lStack_308 = local_dc0._24_8_;
            local_c40 = vpminsd_avx2(local_c40,auVar5);
            local_540 = local_c60._0_8_;
            uStack_538 = local_c60._8_8_;
            uStack_530 = local_c60._16_8_;
            uStack_528 = local_c60._24_8_;
            local_560 = local_dc0._0_8_;
            lStack_558 = local_dc0._8_8_;
            lStack_550 = local_dc0._16_8_;
            lStack_548 = local_dc0._24_8_;
            local_c60 = vpmaxsd_avx2(local_c60,auVar5);
            local_dc0 = auVar5;
            local_720 = local_b80;
          }
        }
        local_590 = local_b20 + local_af4;
        local_e60 = *(undefined1 (*) [32])local_590;
        for (local_ad0 = 0; local_ad0 < local_af8; local_ad0 = local_ad0 + 1) {
          auVar5 = vperm2i128_avx2(auVar5,local_e60,0x28);
          local_e60 = vpalignr_avx2(local_e60,auVar5,0xc);
        }
        local_bc4 = local_e60._28_4_;
        local_220 = local_c00;
        uStack_218 = uStack_bf8;
        uStack_210 = uStack_bf0;
        uStack_208 = uStack_be8;
        local_240 = local_c40._0_8_;
        uStack_238 = local_c40._8_8_;
        uStack_230 = local_c40._16_8_;
        uStack_228 = local_c40._24_8_;
        auVar15._8_8_ = uStack_bf8;
        auVar15._0_8_ = local_c00;
        auVar15._16_8_ = uStack_bf0;
        auVar15._24_8_ = uStack_be8;
        local_2a0 = vpcmpgtd_avx2(auVar15,local_c40);
        local_260 = local_c60._0_8_;
        uStack_258 = local_c60._8_8_;
        uStack_250 = local_c60._16_8_;
        uStack_248 = local_c60._24_8_;
        local_280 = local_c20;
        uStack_278 = uStack_c18;
        uStack_270 = uStack_c10;
        uStack_268 = uStack_c08;
        auVar14._8_8_ = uStack_c18;
        auVar14._0_8_ = local_c20;
        auVar14._16_8_ = uStack_c10;
        auVar14._24_8_ = uStack_c08;
        local_2c0 = vpcmpgtd_avx2(local_c60,auVar14);
        local_2e0 = vpor_avx2(local_2a0,local_2c0);
        if ((((((((((((((((((((((((((((((((local_2e0 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_2e0 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_2e0 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_2e0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_2e0 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_2e0 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_2e0 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_2e0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_2e0 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_2e0 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_2e0 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_2e0 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_2e0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_2e0 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_2e0 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_2e0 >> 0x7f,0) != '\0') ||
                          (local_2e0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_2e0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_2e0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_2e0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2e0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_2e0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_2e0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_2e0 >> 0xbf,0) != '\0') ||
                  (local_2e0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_2e0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_2e0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_2e0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_2e0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_2e0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_2e0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_2e0[0x1f] < '\0') {
          local_ca8->flag = local_ca8->flag | 0x40;
          local_bc4 = 0;
          local_ad8 = 0;
          local_adc = 0;
        }
        local_ca8->score = local_bc4;
        local_ca8->end_query = local_ad8;
        local_ca8->end_ref = local_adc;
        parasail_free(local_b28);
        parasail_free(local_b20);
        parasail_free(local_b18);
        parasail_free(local_b10);
        parasail_free(local_b08);
        local_aa8 = local_ca8;
      }
    }
  }
  return local_aa8;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vE, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vHp = _mm256_add_epi32(vHp, vW);
            vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[i]));
            vHt = _mm256_max_epi32(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHt = _mm256_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            vF = _mm256_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        vH = _mm256_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vF, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vH = _mm256_max_epi32(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}